

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O2

void __thiscall
so_5::impl::coop_repository_basis_t::next_coop_reg_step__parent_child_relation
          (coop_repository_basis_t *this,coop_ref_t *coop_ref,coop_t *parent_coop_ptr)

{
  string *__a;
  string *__b;
  anon_class_16_2_1414b27b do_actions;
  parent_child_coop_names_t names;
  anon_class_16_2_1414b27b local_90;
  rollbacker_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_coop_repository_basis_cpp:565:4)>
  local_80;
  coop_t *local_70;
  anon_class_16_2_f8351835 local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_90.parent_coop_ptr = &local_70;
  local_90.coop_ref = coop_ref;
  local_70 = parent_coop_ptr;
  if (parent_coop_ptr == (coop_t *)0x0) {
    next_coop_reg_step__parent_child_relation::anon_class_16_2_1414b27b::operator()(&local_90);
  }
  else {
    __a = coop_t::query_coop_name_abi_cxx11_(parent_coop_ptr);
    __b = coop_t::query_coop_name_abi_cxx11_
                    ((coop_ref->super___shared_ptr<so_5::coop_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    );
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_58,__a,__b);
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->m_parent_child_relations,&local_58);
    local_80.m_action = &local_68;
    local_80.m_commited = false;
    local_68.this = this;
    local_68.names = &local_58;
    next_coop_reg_step__parent_child_relation::anon_class_16_2_1414b27b::operator()(&local_90);
    local_80.m_commited = true;
    details::rollback_on_exception_details::
    rollbacker_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/coop_repository_basis.cpp:565:4)>
    ::~rollbacker_t(&local_80);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_58);
  }
  return;
}

Assistant:

void
coop_repository_basis_t::next_coop_reg_step__parent_child_relation(
	const coop_ref_t & coop_ref,
	coop_t * parent_coop_ptr )
{
	auto do_actions = [&] {
			coop_private_iface_t::do_registration_specific_actions(
				*coop_ref, parent_coop_ptr );
		};

	if( parent_coop_ptr )
	{
		const parent_child_coop_names_t names{
				parent_coop_ptr->query_coop_name(),
				coop_ref->query_coop_name() };

		m_parent_child_relations.insert( names );

		// In case of error cooperation relation info should be removed
		// from m_parent_child_relations.
		so_5::details::do_with_rollback_on_exception(
			[&] { do_actions(); },
			[&] { m_parent_child_relations.erase( names ); } );
	}
	else
		// It is a very simple case. There is no need for additional
		// actions and rollback on exceptions.
		do_actions();
}